

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_map_constructor(JSContext *ctx,JSValue new_target,int argc,JSValue *argv,int magic)

{
  JSValue func_obj;
  JSValue func_obj_00;
  JSValue method;
  JSValue obj_00;
  JSValue enum_obj;
  JSValue v;
  JSValue v_00;
  JSValue this_obj;
  JSValue this_obj_00;
  JSValue obj_01;
  JSValue obj_02;
  JSValue v_01;
  JSValue JVar1;
  undefined4 uVar2;
  uint uVar3;
  int iVar4;
  uint *opaque;
  void *pvVar5;
  int in_ECX;
  JSContext *in_RDI;
  JSValueUnion *in_R8;
  uint in_R9D;
  JSValue JVar6;
  JSValue JVar7;
  JSValue args [2];
  JSValue value;
  JSValue key;
  BOOL done;
  JSValue ret;
  JSValue item;
  BOOL is_weak;
  BOOL is_set;
  JSValue arr;
  JSValue next_method;
  JSValue iter;
  JSValue adder;
  JSValue obj;
  JSMapState *s;
  JSContext *in_stack_fffffffffffffdb0;
  JSValue in_stack_fffffffffffffdb8;
  JSValue in_stack_fffffffffffffdc8;
  JSValue in_stack_fffffffffffffdd8;
  JSValue in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffdfc;
  int64_t in_stack_fffffffffffffe00;
  BOOL BStack_1f4;
  undefined8 in_stack_fffffffffffffe18;
  JSContext *in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe2c;
  JSContext *in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe3c;
  JSContext *in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  BOOL in_stack_fffffffffffffe4c;
  JSContext *in_stack_fffffffffffffe50;
  JSValue in_stack_fffffffffffffe58;
  JSValueUnion local_198;
  BOOL *local_190;
  int64_t local_170;
  undefined1 local_144 [12];
  int64_t local_138;
  JSValueUnion in_stack_fffffffffffffed0;
  BOOL *in_stack_fffffffffffffed8;
  uint uStack_11c;
  JSValueUnion JVar8;
  JSValueUnion JVar9;
  int64_t iVar10;
  JSValueUnion local_d8;
  int64_t local_d0;
  undefined4 local_70;
  undefined1 auStack_6c [4];
  int64_t local_68;
  BOOL in_stack_ffffffffffffffa0;
  
  local_d8.float64 = 0.0;
  local_d0 = 3;
  JVar9.float64 = 0.0;
  iVar10 = 3;
  uVar2 = in_R9D & 1;
  uVar3 = (uint)((in_R9D & 2) != 0);
  JVar6.u._4_4_ = in_stack_fffffffffffffe2c;
  JVar6.u.int32 = in_stack_fffffffffffffe28;
  JVar6.tag = (int64_t)in_stack_fffffffffffffe30;
  JVar6 = js_create_from_ctor(in_stack_fffffffffffffe20,JVar6,
                              (int)((ulong)in_stack_fffffffffffffe18 >> 0x20));
  local_68 = JVar6.tag;
  iVar4 = JS_IsException(JVar6);
  if (iVar4 == 0) {
    opaque = (uint *)js_mallocz((JSContext *)in_stack_fffffffffffffdc8.u.ptr,
                                in_stack_fffffffffffffdb8.tag);
    if (opaque != (uint *)0x0) {
      init_list_head((list_head *)(opaque + 2));
      *opaque = uVar3;
      JS_SetOpaque(JVar6,opaque);
      opaque[10] = 1;
      pvVar5 = js_malloc(in_stack_fffffffffffffdc8.u.ptr,in_stack_fffffffffffffdb8.tag);
      *(void **)(opaque + 8) = pvVar5;
      if (*(long *)(opaque + 8) != 0) {
        init_list_head(*(list_head **)(opaque + 8));
        opaque[0xb] = 4;
        JVar8.ptr = (void *)((ulong)uStack_11c << 0x20);
        pvVar5 = (void *)0x3;
        if (0 < in_ECX) {
          JVar8 = (JSValueUnion)in_R8->ptr;
          pvVar5 = in_R8[1].ptr;
        }
        JVar7.tag = (int64_t)pvVar5;
        JVar7.u.ptr = JVar8.ptr;
        iVar4 = JS_IsUndefined(JVar7);
        if ((iVar4 != 0) ||
           (v_00.tag = (int64_t)pvVar5, v_00.u.ptr = JVar8.ptr, iVar4 = JS_IsNull(v_00), iVar4 != 0)
           ) {
LAB_0014bc9d:
          local_70 = JVar6.u._0_4_;
          auStack_6c = JVar6.u._4_4_;
          goto LAB_0014bd89;
        }
        obj_01.tag = iVar10;
        obj_01.u.float64 = JVar9.float64;
        this_obj.tag = (int64_t)pvVar5;
        this_obj.u.ptr = JVar8.ptr;
        JVar7 = JS_GetPropertyInternal
                          ((JSContext *)CONCAT44(uVar2,uVar3),obj_01,JVar6.tag._4_4_,this_obj,
                           in_stack_ffffffffffffffa0);
        iVar4 = JS_IsException(JVar7);
        if (iVar4 == 0) {
          iVar4 = JS_IsFunction(in_RDI,JVar7);
          if (iVar4 == 0) {
            JS_ThrowTypeError(in_RDI,"set/add is not a function");
          }
          else {
            obj_00.u._4_4_ = in_stack_fffffffffffffe4c;
            obj_00.u.int32 = in_stack_fffffffffffffe48;
            obj_00.tag = (int64_t)in_stack_fffffffffffffe50;
            JVar7 = JS_GetIterator(in_stack_fffffffffffffe40,obj_00,in_stack_fffffffffffffe3c);
            local_d8 = JVar7.u;
            local_170 = JVar7.tag;
            local_d0 = local_170;
            iVar4 = JS_IsException(JVar7);
            if (iVar4 == 0) {
              obj_02.tag = iVar10;
              obj_02.u.float64 = JVar9.float64;
              this_obj_00.tag = (int64_t)pvVar5;
              this_obj_00.u.float64 = JVar8.float64;
              JVar7 = JS_GetPropertyInternal
                                ((JSContext *)CONCAT44(uVar2,uVar3),obj_02,JVar6.tag._4_4_,
                                 this_obj_00,in_stack_ffffffffffffffa0);
              iVar4 = JS_IsException(JVar7);
              local_198 = in_stack_fffffffffffffed0;
              local_190 = in_stack_fffffffffffffed8;
              if (iVar4 == 0) {
                while( true ) {
                  in_stack_fffffffffffffdb0 = (JSContext *)local_144;
                  enum_obj.u._4_4_ = in_stack_fffffffffffffe4c;
                  enum_obj.u.int32 = in_stack_fffffffffffffe48;
                  enum_obj.tag = (int64_t)in_stack_fffffffffffffe50;
                  method.u._4_4_ = in_stack_fffffffffffffe3c;
                  method.u.int32 = in_stack_fffffffffffffe38;
                  method.tag = (int64_t)in_stack_fffffffffffffe40;
                  JVar7 = JS_IteratorNext(in_stack_fffffffffffffe30,enum_obj,method,
                                          in_stack_fffffffffffffe2c,(JSValue *)local_198.ptr,
                                          local_190);
                  local_198 = JVar7.u;
                  local_190 = (BOOL *)JVar7.tag;
                  iVar4 = JS_IsException(JVar7);
                  if (iVar4 != 0) break;
                  if (local_144._0_4_ != 0) {
                    JS_FreeValue(in_stack_fffffffffffffdb0,in_stack_fffffffffffffdb8);
                    JS_FreeValue(in_stack_fffffffffffffdb0,in_stack_fffffffffffffdb8);
                    JS_FreeValue(in_stack_fffffffffffffdb0,in_stack_fffffffffffffdb8);
                    JS_FreeValue(in_stack_fffffffffffffdb0,in_stack_fffffffffffffdb8);
                    goto LAB_0014bc9d;
                  }
                  if (uVar2 == 0) {
                    in_stack_fffffffffffffe50 = (JSContext *)0x3;
                    in_stack_fffffffffffffdf8 = 0;
                    in_stack_fffffffffffffe00 = 3;
                    v.tag = (int64_t)local_190;
                    v.u.float64 = local_198.float64;
                    in_stack_fffffffffffffe4c = BStack_1f4;
                    iVar4 = JS_IsObject(v);
                    if (iVar4 == 0) {
                      JS_ThrowTypeErrorNotAnObject((JSContext *)0x14b9e5);
                    }
                    else {
                      in_stack_fffffffffffffdd8 =
                           JS_GetPropertyUint32
                                     ((JSContext *)in_stack_fffffffffffffdb8.tag,
                                      in_stack_fffffffffffffdc8,in_stack_fffffffffffffdb8.u._4_4_);
                      in_stack_fffffffffffffe48 = in_stack_fffffffffffffdd8.u._0_4_;
                      in_stack_fffffffffffffe4c = in_stack_fffffffffffffdd8.u._4_4_;
                      in_stack_fffffffffffffe20 = (JSContext *)in_stack_fffffffffffffdd8.tag;
                      iVar4 = JS_IsException(in_stack_fffffffffffffdd8);
                      in_stack_fffffffffffffe50 = in_stack_fffffffffffffe20;
                      if (iVar4 == 0) {
                        in_stack_fffffffffffffdc8 =
                             JS_GetPropertyUint32
                                       ((JSContext *)in_stack_fffffffffffffdb8.tag,
                                        in_stack_fffffffffffffdc8,in_stack_fffffffffffffdb8.u._4_4_)
                        ;
                        in_stack_fffffffffffffe38 = in_stack_fffffffffffffdc8.u._0_4_;
                        in_stack_fffffffffffffe2c = in_stack_fffffffffffffdc8.u._4_4_;
                        in_stack_fffffffffffffe30 = (JSContext *)in_stack_fffffffffffffdc8.tag;
                        iVar4 = JS_IsException(in_stack_fffffffffffffdc8);
                        in_stack_fffffffffffffe50 = in_stack_fffffffffffffe20;
                        if (iVar4 == 0) {
                          func_obj_00.u._4_4_ = in_stack_fffffffffffffdfc;
                          func_obj_00.u.int32 = in_stack_fffffffffffffdf8;
                          func_obj_00.tag = in_stack_fffffffffffffe00;
                          in_stack_fffffffffffffe3c = in_stack_fffffffffffffe2c;
                          in_stack_fffffffffffffe40 = in_stack_fffffffffffffe30;
                          in_stack_fffffffffffffdb8 =
                               JS_Call((JSContext *)in_stack_fffffffffffffdd8.tag,func_obj_00,
                                       in_stack_fffffffffffffde8,in_stack_fffffffffffffdd8.u._4_4_,
                                       (JSValue *)in_stack_fffffffffffffe20);
                          local_144._4_8_ = in_stack_fffffffffffffdb8.u;
                          local_138 = in_stack_fffffffffffffdb8.tag;
                          iVar4 = JS_IsException(in_stack_fffffffffffffdb8);
                          if (iVar4 == 0) {
                            JS_FreeValue(in_stack_fffffffffffffdb0,in_stack_fffffffffffffdb8);
                            JS_FreeValue(in_stack_fffffffffffffdb0,in_stack_fffffffffffffdb8);
                            goto LAB_0014bc07;
                          }
                        }
                      }
                    }
                    JS_FreeValue(in_stack_fffffffffffffdb0,in_stack_fffffffffffffdb8);
                    JS_FreeValue(in_stack_fffffffffffffdb0,in_stack_fffffffffffffdb8);
                    JS_FreeValue(in_stack_fffffffffffffdb0,in_stack_fffffffffffffdb8);
                    break;
                  }
                  func_obj.u._4_4_ = in_stack_fffffffffffffdfc;
                  func_obj.u.int32 = in_stack_fffffffffffffdf8;
                  func_obj.tag = in_stack_fffffffffffffe00;
                  in_stack_fffffffffffffe58 =
                       JS_Call((JSContext *)in_stack_fffffffffffffdd8.tag,func_obj,
                               in_stack_fffffffffffffde8,in_stack_fffffffffffffdd8.u._4_4_,
                               (JSValue *)in_stack_fffffffffffffe20);
                  local_144._4_8_ = in_stack_fffffffffffffe58.u;
                  local_138 = in_stack_fffffffffffffe58.tag;
                  iVar4 = JS_IsException(in_stack_fffffffffffffe58);
                  if (iVar4 != 0) {
                    JS_FreeValue(in_stack_fffffffffffffdb0,in_stack_fffffffffffffdb8);
                    break;
                  }
LAB_0014bc07:
                  JS_FreeValue(in_stack_fffffffffffffdb0,in_stack_fffffffffffffdb8);
                  JS_FreeValue(in_stack_fffffffffffffdb0,in_stack_fffffffffffffdb8);
                }
              }
            }
          }
        }
      }
    }
    v_01.tag = local_d0;
    v_01.u.float64 = local_d8.float64;
    iVar4 = JS_IsObject(v_01);
    if (iVar4 != 0) {
      JS_IteratorClose(in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe4c
                      );
    }
    JS_FreeValue(in_stack_fffffffffffffdb0,in_stack_fffffffffffffdb8);
    JS_FreeValue(in_stack_fffffffffffffdb0,in_stack_fffffffffffffdb8);
    JS_FreeValue(in_stack_fffffffffffffdb0,in_stack_fffffffffffffdb8);
    JS_FreeValue(in_stack_fffffffffffffdb0,in_stack_fffffffffffffdb8);
    local_70 = 0;
    local_68 = 6;
  }
  else {
    local_70 = 0;
    local_68 = 6;
  }
LAB_0014bd89:
  JVar1.u._4_4_ = auStack_6c;
  JVar1.u.int32 = local_70;
  JVar1.tag = local_68;
  return JVar1;
}

Assistant:

static JSValue js_map_constructor(JSContext *ctx, JSValueConst new_target,
                                  int argc, JSValueConst *argv, int magic)
{
    JSMapState *s;
    JSValue obj, adder = JS_UNDEFINED, iter = JS_UNDEFINED, next_method = JS_UNDEFINED;
    JSValueConst arr;
    BOOL is_set, is_weak;

    is_set = magic & MAGIC_SET;
    is_weak = ((magic & MAGIC_WEAK) != 0);
    obj = js_create_from_ctor(ctx, new_target, JS_CLASS_MAP + magic);
    if (JS_IsException(obj))
        return JS_EXCEPTION;
    s = js_mallocz(ctx, sizeof(*s));
    if (!s)
        goto fail;
    init_list_head(&s->records);
    s->is_weak = is_weak;
    JS_SetOpaque(obj, s);
    s->hash_size = 1;
    s->hash_table = js_malloc(ctx, sizeof(s->hash_table[0]) * s->hash_size);
    if (!s->hash_table)
        goto fail;
    init_list_head(&s->hash_table[0]);
    s->record_count_threshold = 4;

    arr = JS_UNDEFINED;
    if (argc > 0)
        arr = argv[0];
    if (!JS_IsUndefined(arr) && !JS_IsNull(arr)) {
        JSValue item, ret;
        BOOL done;

        adder = JS_GetProperty(ctx, obj, is_set ? JS_ATOM_add : JS_ATOM_set);
        if (JS_IsException(adder))
            goto fail;
        if (!JS_IsFunction(ctx, adder)) {
            JS_ThrowTypeError(ctx, "set/add is not a function");
            goto fail;
        }

        iter = JS_GetIterator(ctx, arr, FALSE);
        if (JS_IsException(iter))
            goto fail;
        next_method = JS_GetProperty(ctx, iter, JS_ATOM_next);
        if (JS_IsException(next_method))
            goto fail;

        for(;;) {
            item = JS_IteratorNext(ctx, iter, next_method, 0, NULL, &done);
            if (JS_IsException(item))
                goto fail;
            if (done) {
                JS_FreeValue(ctx, item);
                break;
            }
            if (is_set) {
                ret = JS_Call(ctx, adder, obj, 1, (JSValueConst *)&item);
                if (JS_IsException(ret)) {
                    JS_FreeValue(ctx, item);
                    goto fail;
                }
            } else {
                JSValue key, value;
                JSValueConst args[2];
                key = JS_UNDEFINED;
                value = JS_UNDEFINED;
                if (!JS_IsObject(item)) {
                    JS_ThrowTypeErrorNotAnObject(ctx);
                    goto fail1;
                }
                key = JS_GetPropertyUint32(ctx, item, 0);
                if (JS_IsException(key))
                    goto fail1;
                value = JS_GetPropertyUint32(ctx, item, 1);
                if (JS_IsException(value))
                    goto fail1;
                args[0] = key;
                args[1] = value;
                ret = JS_Call(ctx, adder, obj, 2, args);
                if (JS_IsException(ret)) {
                fail1:
                    JS_FreeValue(ctx, item);
                    JS_FreeValue(ctx, key);
                    JS_FreeValue(ctx, value);
                    goto fail;
                }
                JS_FreeValue(ctx, key);
                JS_FreeValue(ctx, value);
            }
            JS_FreeValue(ctx, ret);
            JS_FreeValue(ctx, item);
        }
        JS_FreeValue(ctx, next_method);
        JS_FreeValue(ctx, iter);
        JS_FreeValue(ctx, adder);
    }
    return obj;
 fail:
    if (JS_IsObject(iter)) {
        /* close the iterator object, preserving pending exception */
        JS_IteratorClose(ctx, iter, TRUE);
    }
    JS_FreeValue(ctx, next_method);
    JS_FreeValue(ctx, iter);
    JS_FreeValue(ctx, adder);
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}